

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_tree.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar2;
  pointer pcVar3;
  void *pvVar4;
  void *pvVar5;
  ostream *poVar6;
  char *__s;
  undefined1 local_c0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  property;
  configuration c;
  string filename;
  
  if (argc == 1) {
    __s = "full.properties";
  }
  else {
    __s = argv[1];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tree.m_children,__s,(allocator<char> *)local_c0);
  property.second.m_children = &c.tree.m_data._M_string_length;
  c.tree.m_data._M_dataplus._M_p = (pointer)0x0;
  c.tree.m_data._M_string_length._0_1_ = 0;
  pvVar4 = operator_new(0x20);
  pvVar5 = operator_new(0x70);
  *(void **)((long)pvVar4 + 8) = pvVar5;
  *(undefined8 *)((long)pvVar5 + 0x48) = 0;
  *(long *)((long)pvVar5 + 0x50) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x68) = (long)pvVar5 + 0x60;
  *(long *)((long)pvVar5 + 0x60) = (long)pvVar5 + 0x60;
  *(undefined8 *)((long)pvVar4 + 0x18) = 0;
  c.tree.m_data.field_2._8_8_ = pvVar4;
  configuration::load((configuration *)&property.second.m_children,(string *)&c.tree.m_children);
  ppVar2 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             **)(c.tree.m_data.field_2._8_8_ + 8);
  pcVar3 = ppVar2[1].second.m_data._M_dataplus._M_p;
  ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(pcVar3 + -0x60);
  if (pcVar3 == (pointer)0x0) {
    ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0;
  }
  while (ppVar1 != ppVar2) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_c0,ppVar1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_c0,(long)property.first._M_dataplus._M_p
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)property.first.field_2._8_8_,
                        (long)property.second.m_data._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    boost::property_tree::
    basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&property.first.field_2 + 8));
    if (local_c0 != (undefined1  [8])&property.first._M_string_length) {
      operator_delete((void *)local_c0,property.first._M_string_length + 1);
    }
    pcVar3 = ppVar1[1].second.m_data._M_dataplus._M_p;
    ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(pcVar3 + -0x60);
    if (pcVar3 == (pointer)0x0) {
      ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x0;
    }
  }
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&property.second.m_children);
  if ((size_type *)c.tree.m_children != &filename._M_string_length) {
    operator_delete(c.tree.m_children,filename._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  try {
    // read input from the given file
    std::string filename(1 == argc ? "full.properties" : argv[1]);
    configuration c;
    c.load(filename);
    for (auto property : c.tree) {
      std::cout << property.first << "=" << property.second.data() << std::endl;
    }
  } catch (std::exception &e) {
    std::cout << "Error: " << e.what() << "\n";
  }
  return 0;
}